

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O3

Type * anon_unknown.dwarf_18458::load_alias(TypeNode *node,Factory *factory)

{
  Type *pTVar1;
  char *in_RCX;
  string source;
  string local_80;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)node->xml,(xmlNodePtr)"source",in_RCX);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  pTVar1 = Factory::build(factory,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  Typelib::Registry::alias((string *)factory->m_registry,(string *)&local_60,(string *)&node->name);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return pTVar1;
}

Assistant:

Type const* load_alias(TypeNode const& node, Factory& factory)
    {
        string source = getAttribute<string>(node.xml, "source");
        Type const* type = factory.build(source);
        factory.alias(node, source);
        return type;
    }